

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res012.c
# Opt level: O1

vorbis_look_residue * res0_look(vorbis_dsp_state *vd,vorbis_info_mode *vm,vorbis_info_residue *vr)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  uint uVar5;
  undefined8 *puVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  void *pvVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  size_t sVar18;
  int iVar19;
  size_t __nmemb;
  uint local_60;
  
  puVar6 = (undefined8 *)calloc(1,0x40);
  pvVar10 = vd->vi->codec_setup;
  *puVar6 = vr;
  *(int *)(puVar6 + 1) = vm->mapping;
  iVar2 = *(int *)((long)vr + 0x14);
  __nmemb = (size_t)iVar2;
  *(int *)((long)puVar6 + 0xc) = iVar2;
  lVar15 = *(long *)((long)pvVar10 + 0x1428);
  puVar6[3] = lVar15;
  lVar14 = (long)*(int *)((long)vr + 0x18) * 0x60;
  puVar6[4] = lVar15 + lVar14;
  uVar4 = *(undefined8 *)(lVar15 + lVar14);
  pvVar7 = calloc(__nmemb,8);
  puVar6[5] = pvVar7;
  if ((long)__nmemb < 1) {
    uVar16 = 0;
  }
  else {
    sVar18 = 0;
    uVar16 = 0;
    iVar19 = 0;
    do {
      uVar3 = *(uint *)((long)vr + sVar18 * 4 + 0x1c);
      if (uVar3 != 0) {
        uVar5 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar1 = (uVar5 ^ 0xffffffe0) + 0x21;
        if ((int)uVar16 < (int)uVar1) {
          uVar16 = uVar1;
        }
        pvVar8 = calloc((ulong)uVar1,8);
        *(void **)((long)pvVar7 + sVar18 * 8) = pvVar8;
        uVar9 = 0;
        do {
          if ((uVar3 >> ((uint)uVar9 & 0x1f) & 1) != 0) {
            lVar15 = (long)iVar19;
            iVar19 = iVar19 + 1;
            *(long *)(*(long *)((long)pvVar7 + sVar18 * 8) + uVar9 * 8) =
                 (long)*(int *)((long)vr + lVar15 * 4 + 0x11c) * 0x60 +
                 *(long *)((long)pvVar10 + 0x1428);
          }
          uVar9 = uVar9 + 1;
        } while ((uVar5 ^ 0xffffffe0) + 0x21 + (uint)(uVar1 == 0) != uVar9);
      }
      sVar18 = sVar18 + 1;
    } while (sVar18 != __nmemb);
  }
  *(int *)(puVar6 + 6) = iVar2;
  local_60 = (uint)uVar4;
  if (1 < (int)local_60) {
    iVar19 = *(int *)(puVar6 + 6);
    iVar13 = local_60 - 1;
    do {
      iVar19 = iVar19 * iVar2;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    *(int *)(puVar6 + 6) = iVar19;
  }
  *(uint *)(puVar6 + 2) = uVar16;
  iVar19 = *(int *)(puVar6 + 6);
  lVar15 = (long)iVar19;
  pvVar10 = malloc(lVar15 * 8);
  puVar6[7] = pvVar10;
  if (0 < lVar15) {
    lVar14 = 0;
    do {
      pvVar7 = malloc((long)(int)local_60 * 4);
      *(void **)((long)pvVar10 + lVar14 * 8) = pvVar7;
      if (0 < (int)local_60) {
        uVar9 = 0;
        lVar17 = lVar14;
        lVar12 = (long)(iVar19 / iVar2);
        do {
          lVar11 = lVar17 / lVar12;
          lVar17 = lVar17 % lVar12;
          lVar12 = lVar12 / (long)__nmemb;
          *(int *)((long)pvVar7 + uVar9 * 4) = (int)lVar11;
          uVar9 = uVar9 + 1;
        } while ((local_60 & 0x7fffffff) != uVar9);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar15);
  }
  return puVar6;
}

Assistant:

vorbis_look_residue *res0_look(vorbis_dsp_state *vd,vorbis_info_mode *vm,
			  vorbis_info_residue *vr){
  vorbis_info_residue0 *info=(vorbis_info_residue0 *)vr;
  vorbis_look_residue0 *look=(vorbis_look_residue0 *)_ogg_calloc(1,sizeof(*look));
  codec_setup_info     *ci=(codec_setup_info *)vd->vi->codec_setup;

  int j,k,acc=0;
  int dim;
  int maxstage=0;
  look->info=info;
  look->map=vm->mapping;

  look->parts=info->partitions;
  look->fullbooks=ci->fullbooks;
  look->phrasebook=ci->fullbooks+info->groupbook;
  dim=look->phrasebook->dim;

  look->partbooks=(codebook ***)_ogg_calloc(look->parts,sizeof(*look->partbooks));

  for(j=0;j<look->parts;j++){
    int stages=ilog(info->secondstages[j]);
    if(stages){
      if(stages>maxstage)maxstage=stages;
      look->partbooks[j]=(codebook **)_ogg_calloc(stages,sizeof(*look->partbooks[j]));
      for(k=0;k<stages;k++)
	if(info->secondstages[j]&(1<<k)){
	  look->partbooks[j][k]=ci->fullbooks+info->booklist[acc++];
#ifdef TRAIN_RES
	  look->training_data[k][j]=calloc(look->partbooks[j][k]->entries,
					   sizeof(***look->training_data));
#endif
	}
    }
  }

  look->partvals=look->parts;
  for(j=1;j<dim;j++)look->partvals*=look->parts;
  look->stages=maxstage;
  look->decodemap=(int **)_ogg_malloc(look->partvals*sizeof(*look->decodemap));
  for(j=0;j<look->partvals;j++){
    long val=j;
    long mult=look->partvals/look->parts;
    look->decodemap[j]=(int *)_ogg_malloc(dim*sizeof(*look->decodemap[j]));
    for(k=0;k<dim;k++){
      long deco=val/mult;
      val-=deco*mult;
      mult/=look->parts;
      look->decodemap[j][k]=deco;
    }
  }

  return(look);
}